

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall
Graph<std::pair<double,_double>_>::clearGraph(Graph<std::pair<double,_double>_> *this)

{
  Vertex<std::pair<double,_double>_> *this_00;
  bool bVar1;
  reference ppVVar2;
  reference ppEVar3;
  int local_70 [2];
  pair<int,_int> local_68;
  int local_60 [2];
  pair<int,_int> local_58;
  Edge<std::pair<double,_double>_> *local_50;
  Edge<std::pair<double,_double>_> *edge;
  iterator __end0_1;
  iterator __begin0_1;
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
  *__range2;
  Vertex<std::pair<double,_double>_> *vertex;
  iterator __end0;
  iterator __begin0;
  vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  *__range1;
  Graph<std::pair<double,_double>_> *this_local;
  
  __end0 = std::
           vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
           ::begin(&this->vertexSet);
  vertex = (Vertex<std::pair<double,_double>_> *)
           std::
           vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
           ::end(&this->vertexSet);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Vertex<std::pair<double,_double>_>_**,_std::vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
                                *)&vertex);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<Vertex<std::pair<double,_double>_>_**,_std::vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
              ::operator*(&__end0);
    this_00 = *ppVVar2;
    __end0_1 = std::
               vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
               ::begin(&this_00->outgoing);
    edge = (Edge<std::pair<double,_double>_> *)
           std::
           vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
           ::end(&this_00->outgoing);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0_1,
                         (__normal_iterator<Edge<std::pair<double,_double>_>_**,_std::vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>_>
                          *)&edge);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<Edge<std::pair<double,_double>_>_**,_std::vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>_>
                ::operator*(&__end0_1);
      local_50 = *ppEVar3;
      if (local_50 != (Edge<std::pair<double,_double>_> *)0x0) {
        operator_delete(local_50,0x18);
      }
      __gnu_cxx::
      __normal_iterator<Edge<std::pair<double,_double>_>_**,_std::vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>_>
      ::operator++(&__end0_1);
    }
    if (this_00 != (Vertex<std::pair<double,_double>_> *)0x0) {
      Vertex<std::pair<double,_double>_>::~Vertex(this_00);
      operator_delete(this_00,0x88);
    }
    __gnu_cxx::
    __normal_iterator<Vertex<std::pair<double,_double>_>_**,_std::vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
    ::operator++(&__end0);
  }
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear(&this->vertexMap);
  local_60[1] = 0;
  local_60[0] = 0;
  local_58 = std::make_pair<int,int>(local_60 + 1,local_60);
  std::pair<double,double>::operator=((pair<double,double> *)&this->minCoords,&local_58);
  local_70[1] = 0;
  local_70[0] = 0;
  local_68 = std::make_pair<int,int>(local_70 + 1,local_70);
  std::pair<double,double>::operator=((pair<double,double> *)&this->maxCoords,&local_68);
  return;
}

Assistant:

void Graph<T>::clearGraph() {
    for (auto vertex : vertexSet) {
        for (auto edge : vertex->outgoing) {
            delete edge;
        }
        delete vertex;
    }
    vertexMap.clear();
    minCoords = make_pair(0,0);
    maxCoords = make_pair(0,0);
}